

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Buffer.cc
# Opt level: O3

void __thiscall Pl_Buffer::~Pl_Buffer(Pl_Buffer *this)

{
  ~Pl_Buffer(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

void
Pl_Buffer::write(unsigned char const* buf, size_t len)
{
    if (!len) {
        return;
    }
    m->data.append(reinterpret_cast<char const*>(buf), len);
    m->ready = false;

    if (next()) {
        next()->write(buf, len);
    }
}